

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

void vkt::clipping::anon_unknown_0::addClippingTests(TestCaseGroup *clippingTestsGroup)

{
  bool bVar1;
  VkPrimitiveTopology VVar2;
  TestContext *testCtx;
  TestContext *testCtx_00;
  int iVar3;
  int iVar4;
  TestCaseGroup *pTVar5;
  ulong uVar6;
  TestNode *node;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  undefined8 extraout_RDX_04;
  char **extraout_RDX_05;
  char **value;
  char *pcVar8;
  char **extraout_RDX_06;
  uint uVar9;
  code *testFunc;
  LineOrientation arg0;
  ulong in_R9;
  long lVar10;
  uint uVar11;
  int iVar12;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  int numCullPlanes;
  int local_138;
  allocator<char> local_131;
  string shaderGroupName;
  string mainGroupName;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> clipVolumeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> shaderGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> mainGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> clipDistanceGroup;
  string local_50;
  
  testCtx = (clippingTestsGroup->super_TestNode).m_testCtx;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"clip_volume","clipping with the clip volume");
  clipVolumeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"inside","");
  uVar7 = extraout_RDX;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar5;
  for (lVar10 = 0;
      pTVar5 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, lVar10 != 0x28; lVar10 = lVar10 + 4) {
    VVar2 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar10);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (&mainGroupName,(drawutil *)(ulong)VVar2,(VkPrimitiveTopology)uVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderGroupName,"",(allocator<char> *)&local_98);
    in_R9 = (ulong)VVar2;
    addFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
              (pTVar5,&mainGroupName,&shaderGroupName,ClipVolume::initPrograms,
               ClipVolume::testPrimitivesInside,VVar2);
    std::__cxx11::string::~string((string *)&shaderGroupName);
    std::__cxx11::string::~string((string *)&mainGroupName);
    uVar7 = extraout_RDX_00;
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clipVolumeGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar5->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"outside","");
  uVar7 = extraout_RDX_01;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar5;
  for (lVar10 = 0;
      pTVar5 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, lVar10 != 0x28; lVar10 = lVar10 + 4) {
    VVar2 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar10);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (&mainGroupName,(drawutil *)(ulong)VVar2,(VkPrimitiveTopology)uVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderGroupName,"",(allocator<char> *)&local_98);
    in_R9 = (ulong)VVar2;
    addFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
              (pTVar5,&mainGroupName,&shaderGroupName,ClipVolume::initPrograms,
               ClipVolume::testPrimitivesOutside,VVar2);
    std::__cxx11::string::~string((string *)&shaderGroupName);
    std::__cxx11::string::~string((string *)&mainGroupName);
    uVar7 = extraout_RDX_02;
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clipVolumeGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar5->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"depth_clamp","");
  uVar7 = extraout_RDX_03;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar5;
  for (lVar10 = 0;
      pTVar5 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, arg0 = (LineOrientation)in_R9, lVar10 != 0x28; lVar10 = lVar10 + 4) {
    VVar2 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar10);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (&mainGroupName,(drawutil *)(ulong)VVar2,(VkPrimitiveTopology)uVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderGroupName,"",(allocator<char> *)&local_98);
    in_R9 = (ulong)VVar2;
    addFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
              (pTVar5,&mainGroupName,&shaderGroupName,ClipVolume::initPrograms,
               ClipVolume::testPrimitivesDepthClamp,VVar2);
    std::__cxx11::string::~string((string *)&shaderGroupName);
    std::__cxx11::string::~string((string *)&mainGroupName);
    uVar7 = extraout_RDX_04;
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clipVolumeGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar5->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"clipped","");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mainGroupName,"large_points",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderGroupName,"",(allocator<char> *)&local_50);
  testFunc = ClipVolume::testLargePoints;
  addFunctionCaseWithPrograms
            (pTVar5,&mainGroupName,&shaderGroupName,ClipVolume::initProgramsPointSize,
             ClipVolume::testLargePoints);
  std::__cxx11::string::~string((string *)&shaderGroupName);
  std::__cxx11::string::~string((string *)&mainGroupName);
  pTVar5 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mainGroupName,"wide_lines_axis_aligned",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderGroupName,"",(allocator<char> *)&local_50);
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            (pTVar5,&mainGroupName,&shaderGroupName,(Function)0x0,testFunc,arg0);
  std::__cxx11::string::~string((string *)&shaderGroupName);
  std::__cxx11::string::~string((string *)&mainGroupName);
  pTVar5 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mainGroupName,"wide_lines_diagonal",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderGroupName,"",(allocator<char> *)&local_50);
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            (pTVar5,&mainGroupName,&shaderGroupName,(Function)0x1,testFunc,arg0);
  std::__cxx11::string::~string((string *)&shaderGroupName);
  std::__cxx11::string::~string((string *)&mainGroupName);
  pTVar5 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clipVolumeGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar5->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar5 = clipVolumeGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  clipVolumeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(&clippingTestsGroup->super_TestNode,&pTVar5->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&clipVolumeGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"user_defined","user-defined clip planes");
  value = extraout_RDX_05;
  clipDistanceGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar5;
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
      de::toString<char_const*>
                (&shaderGroupName,(de *)(addClippingTests::caseGroups + lVar10),value);
      pcVar8 = "";
      if (iVar12 == 1) {
        pcVar8 = "_dynamic_index";
      }
      std::operator+(&mainGroupName,&shaderGroupName,pcVar8);
      std::__cxx11::string::~string((string *)&shaderGroupName);
      pTVar5 = (TestCaseGroup *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,mainGroupName._M_dataplus._M_p,"");
      uVar11 = 0;
      mainGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      .ptr = pTVar5;
      while( true ) {
        pTVar5 = mainGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        if (uVar11 == 4) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&group,"vert",(allocator<char> *)&local_98);
        uVar9 = uVar11 & 1;
        pcVar8 = "_tess";
        if (uVar9 == 0) {
          pcVar8 = "";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &clipVolumeGroup,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&group,
                       pcVar8);
        pcVar8 = "";
        if (1 < uVar11) {
          pcVar8 = "_geom";
        }
        std::operator+(&shaderGroupName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &clipVolumeGroup,pcVar8);
        std::__cxx11::string::~string((string *)&clipVolumeGroup);
        std::__cxx11::string::~string((string *)&group);
        pTVar5 = (TestCaseGroup *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,shaderGroupName._M_dataplus._M_p,"");
        bVar1 = addClippingTests::caseGroups[lVar10].useCullDistance;
        uVar6 = 10;
        if (uVar9 == 0) {
          uVar6 = 3;
        }
        local_138 = 1;
        shaderGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = pTVar5;
        while( true ) {
          pTVar5 = shaderGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          if (8 < local_138) break;
          numCullPlanes = 8 - local_138;
          if (7 < 8 - local_138) {
            numCullPlanes = 8;
          }
          if (bVar1 == false) {
            numCullPlanes = 0;
          }
          de::toString<int>((string *)&group,&local_138);
          iVar3 = numCullPlanes;
          if (numCullPlanes < 1) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_131);
          }
          else {
            de::toString<int>(&local_50,&numCullPlanes);
            std::operator+(&local_98,"_",&local_50);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &clipVolumeGroup,(string *)&group,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          if (0 < iVar3) {
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::__cxx11::string::~string((string *)&group);
          pTVar5 = shaderGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&group,addClippingTests::caseGroups[lVar10].description,
                     (allocator<char> *)&local_98);
          iVar4 = local_138;
          iVar3 = numCullPlanes;
          testCtx_00 = (pTVar5->super_TestNode).m_testCtx;
          node = (TestNode *)operator_new(0x90);
          TestCase::TestCase((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,
                             (string *)&clipVolumeGroup,(string *)&group);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bf51f0;
          node[1]._vptr_TestNode = (_func_int **)ClipDistance::initPrograms;
          node[1].m_testCtx = (TestContext *)ClipDistance::testClipDistance;
          node[1].m_name._M_dataplus._M_p =
               (pointer)((ulong)(1 < uVar11) << 0x30 |
                        (ulong)uVar9 << 0x28 | uVar6 | (ulong)(iVar12 == 1) << 0x20);
          node[1].m_name._M_string_length = CONCAT44(iVar3,iVar4);
          tcu::TestNode::addChild(&pTVar5->super_TestNode,node);
          std::__cxx11::string::~string((string *)&group);
          std::__cxx11::string::~string((string *)&clipVolumeGroup);
          local_138 = local_138 + 1;
        }
        shaderGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = (TestCaseGroup *)0x0;
        tcu::TestNode::addChild
                  (&(mainGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,&pTVar5->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&shaderGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
        std::__cxx11::string::~string((string *)&shaderGroupName);
        uVar11 = uVar11 + 1;
      }
      mainGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      .ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(clipDistanceGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar5->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&mainGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      std::__cxx11::string::~string((string *)&mainGroupName);
      value = extraout_RDX_06;
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"complementarity","");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar5;
  for (local_98._M_dataplus._M_p._0_4_ = 1;
      pTVar5 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, (int)local_98._M_dataplus._M_p < 9;
      local_98._M_dataplus._M_p._0_4_ = (int)local_98._M_dataplus._M_p + 1) {
    de::toString<int>(&shaderGroupName,(int *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mainGroupName,shaderGroupName._M_dataplus._M_p,
               (allocator<char> *)&mainGroup);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&clipVolumeGroup,"",(allocator<char> *)&shaderGroup);
    addFunctionCaseWithPrograms<int>
              (pTVar5,&mainGroupName,(string *)&clipVolumeGroup,
               ClipDistanceComplementarity::initPrograms,
               ClipDistanceComplementarity::testComplementarity,(int)local_98._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&clipVolumeGroup);
    std::__cxx11::string::~string((string *)&mainGroupName);
    std::__cxx11::string::~string((string *)&shaderGroupName);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(&clippingTestsGroup->super_TestNode,&pTVar5->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar5 = clipDistanceGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  clipDistanceGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(&clippingTestsGroup->super_TestNode,&pTVar5->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&clipDistanceGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return;
}

Assistant:

void addClippingTests (tcu::TestCaseGroup* clippingTestsGroup)
{
	tcu::TestContext& testCtx = clippingTestsGroup->getTestContext();

	// Clipping against the clip volume
	{
		using namespace ClipVolume;

		static const VkPrimitiveTopology cases[] =
		{
			VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
		};

		MovePtr<tcu::TestCaseGroup> clipVolumeGroup(new tcu::TestCaseGroup(testCtx, "clip_volume", "clipping with the clip volume"));

		// Fully inside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "inside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesInside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Fully outside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "outside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesOutside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Depth clamping
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "depth_clamp", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesDepthClamp, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Large points and wide lines
		{
			// \note For both points and lines, if an unsupported size/width is selected, the nearest supported size will be chosen.
			//       We do have to check for feature support though.

			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "clipped", ""));

			addFunctionCaseWithPrograms(group.get(), "large_points", "", initProgramsPointSize, testLargePoints);

			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_axis_aligned", "", initPrograms, testWideLines, LINE_ORIENTATION_AXIS_ALIGNED);
			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_diagonal",	 "", initPrograms, testWideLines, LINE_ORIENTATION_DIAGONAL);

			clipVolumeGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipVolumeGroup.release());
	}

	// User-defined clip planes
	{
		MovePtr<tcu::TestCaseGroup> clipDistanceGroup(new tcu::TestCaseGroup(testCtx, "user_defined", "user-defined clip planes"));

		// ClipDistance, CullDistance and maxCombinedClipAndCullDistances usage
		{
			using namespace ClipDistance;

			static const struct
			{
				const char* const	groupName;
				const char* const	description;
				bool				useCullDistance;
			} caseGroups[] =
			{
				{ "clip_distance",		"use ClipDistance",										false },
				{ "clip_cull_distance",	"use ClipDistance and CullDistance at the same time",	true  },
			};

			const deUint32 flagTessellation = 1u << 0;
			const deUint32 flagGeometry		= 1u << 1;

			for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(caseGroups); ++groupNdx)
			for (int indexingMode = 0; indexingMode < 2; ++indexingMode)
			{
				const bool			dynamicIndexing	= (indexingMode == 1);
				const std::string	mainGroupName	= de::toString(caseGroups[groupNdx].groupName) + (dynamicIndexing ? "_dynamic_index" : "");

				MovePtr<tcu::TestCaseGroup>	mainGroup(new tcu::TestCaseGroup(testCtx, mainGroupName.c_str(), ""));

				for (deUint32 shaderMask = 0u; shaderMask <= (flagTessellation | flagGeometry); ++shaderMask)
				{
					const bool			useTessellation	= (shaderMask & flagTessellation) != 0;
					const bool			useGeometry		= (shaderMask & flagGeometry) != 0;
					const std::string	shaderGroupName	= std::string("vert") + (useTessellation ? "_tess" : "") + (useGeometry ? "_geom" : "");

					MovePtr<tcu::TestCaseGroup>	shaderGroup(new tcu::TestCaseGroup(testCtx, shaderGroupName.c_str(), ""));

					for (int numClipPlanes = 1; numClipPlanes <= MAX_CLIP_DISTANCES; ++numClipPlanes)
					{
						const int					numCullPlanes	= (caseGroups[groupNdx].useCullDistance
																		? std::min(static_cast<int>(MAX_CULL_DISTANCES), MAX_COMBINED_CLIP_AND_CULL_DISTANCES - numClipPlanes)
																		: 0);
						const std::string			caseName		= de::toString(numClipPlanes) + (numCullPlanes > 0 ? "_" + de::toString(numCullPlanes) : "");
						const VkPrimitiveTopology	topology		= (useTessellation ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST : VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);

						addFunctionCaseWithPrograms<CaseDefinition>(
							shaderGroup.get(), caseName, caseGroups[groupNdx].description, initPrograms, testClipDistance,
							CaseDefinition(topology, numClipPlanes, numCullPlanes, useTessellation, useGeometry, dynamicIndexing));
					}
					mainGroup->addChild(shaderGroup.release());
				}
				clipDistanceGroup->addChild(mainGroup.release());
			}
		}

		// Complementarity criterion (i.e. clipped and not clipped areas must add up to a complete primitive with no holes nor overlap)
		{
			using namespace ClipDistanceComplementarity;

			MovePtr<tcu::TestCaseGroup>	group(new tcu::TestCaseGroup(testCtx, "complementarity", ""));

			for (int numClipDistances = 1; numClipDistances <= MAX_CLIP_DISTANCES; ++numClipDistances)
				addFunctionCaseWithPrograms<int>(group.get(), de::toString(numClipDistances).c_str(), "", initPrograms, testComplementarity, numClipDistances);

			clippingTestsGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipDistanceGroup.release());
	}
}